

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

_Bool is_matching_txid(wally_tx *tx,uchar *txid,size_t txid_len)

{
  int iVar1;
  uchar local_48 [7];
  _Bool ret;
  uchar src_txid [32];
  size_t txid_len_local;
  uchar *txid_local;
  wally_tx *tx_local;
  
  if (((tx == (wally_tx *)0x0) || (txid == (uchar *)0x0)) || (txid_len != 0x20)) {
    tx_local._7_1_ = false;
  }
  else {
    src_txid._24_8_ = txid_len;
    iVar1 = wally_tx_get_txid(tx,local_48,0x20);
    if (iVar1 == 0) {
      iVar1 = memcmp(local_48,txid,src_txid._24_8_);
      tx_local._7_1_ = iVar1 == 0;
      wally_clear(local_48,0x20);
    }
    else {
      tx_local._7_1_ = false;
    }
  }
  return tx_local._7_1_;
}

Assistant:

static bool is_matching_txid(const struct wally_tx *tx,
                             const unsigned char *txid, size_t txid_len)
{
    unsigned char src_txid[WALLY_TXHASH_LEN];
    bool ret;

    if (!tx || !txid || txid_len != WALLY_TXHASH_LEN)
        return false;

    if (wally_tx_get_txid(tx, src_txid, sizeof(src_txid)) != WALLY_OK)
        return false;

    ret = memcmp(src_txid, txid, txid_len) == 0;
    wally_clear(src_txid, sizeof(src_txid));
    return ret;
}